

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O2

ArgConvertResult<(absl::lts_20240722::FormatConversionCharSet)262144>
absl::lts_20240722::str_format_internal::FormatConvertImpl
          (string_view v,FormatConversionSpecImpl conv,FormatSinkImpl *sink)

{
  ArgConvertResult<(absl::lts_20240722::FormatConversionCharSet)262144> AVar1;
  
  AVar1.value = anon_unknown_53::ConvertStringArg(v,conv,sink);
  return (ArgConvertResult<(absl::lts_20240722::FormatConversionCharSet)262144>)AVar1.value;
}

Assistant:

StringConvertResult FormatConvertImpl(string_view v,
                                      const FormatConversionSpecImpl conv,
                                      FormatSinkImpl *sink) {
  return {ConvertStringArg(v, conv, sink)};
}